

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.h
# Opt level: O3

uint __thiscall CVmObjByteArray::calc_hash(CVmObjByteArray *this,vm_obj_id_t self,int param_2)

{
  ulong uVar1;
  uint *puVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  
  puVar2 = (uint *)(this->super_CVmObject).ext_;
  uVar4 = (ulong)*puVar2;
  if (uVar4 != 0) {
    lVar5 = 1;
    uVar3 = 0;
    do {
      uVar1 = lVar5 - 1;
      uVar8 = (uint)uVar1;
      uVar6 = (ulong)(uVar8 & 0x7fff);
      uVar7 = 0x8000 - uVar6;
      if (uVar4 <= uVar7) {
        uVar7 = uVar4;
      }
      lVar5 = lVar5 + uVar7;
      uVar9 = 0;
      do {
        uVar3 = uVar3 + *(byte *)(uVar6 + *(long *)(*(long *)(puVar2 + (uVar1 >> 0x1c) * 2 + 1) +
                                                   (ulong)(uVar8 >> 0xc & 0xfff8)) + uVar9);
        uVar9 = uVar9 + 1;
      } while (uVar7 != uVar9);
      uVar4 = uVar4 - uVar7;
    } while (uVar4 != 0);
    return uVar3;
  }
  return 0;
}

Assistant:

const char *get_ext_ptr() const { return ext_; }